

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O0

void __thiscall
r_exec::_GMonitor::_GMonitor
          (_GMonitor *this,PMDLController *controller,BindingMap *bindings,uint64_t deadline,
          uint64_t sim_thz,Fact *goal,Fact *f_imdl)

{
  ulong uVar1;
  Goal *pGVar2;
  Sim *pSVar3;
  _Fact *p_Var4;
  Fact *goal_local;
  uint64_t sim_thz_local;
  uint64_t deadline_local;
  BindingMap *bindings_local;
  PMDLController *controller_local;
  _GMonitor *this_local;
  
  Monitor::Monitor(&this->super_Monitor,&controller->super_MDLController,bindings,goal);
  (this->super_Monitor).super__Object._vptr__Object = (_func_int **)&PTR___GMonitor_002eb868;
  this->deadline = deadline;
  this->sim_thz = sim_thz;
  core::P<r_exec::Fact>::P(&this->f_imdl,f_imdl);
  SimOutcomes::SimOutcomes(&this->sim_successes);
  SimOutcomes::SimOutcomes(&this->sim_failures);
  uVar1 = (*Now)();
  this->simulating = (ulong)(uVar1 < sim_thz);
  pGVar2 = _Fact::get_goal(&goal->super__Fact);
  pSVar3 = core::P<r_exec::Sim>::operator->(&pGVar2->sim);
  this->sim_mode = pSVar3->mode;
  p_Var4 = &core::P<r_exec::Fact>::operator->(&(this->super_Monitor).target)->super__Fact;
  pGVar2 = _Fact::get_goal(p_Var4);
  p_Var4 = Goal::get_target(pGVar2);
  this->goal_target = p_Var4;
  return;
}

Assistant:

_GMonitor::_GMonitor(PMDLController *controller,
                     BindingMap *bindings,
                     uint64_t deadline,
                     uint64_t sim_thz,
                     Fact *goal,
                     Fact *f_imdl): Monitor(controller,
                                 bindings,
                                 goal),
    deadline(deadline),
    sim_thz(sim_thz),
    f_imdl(f_imdl)   // goal is f0->g->f1->object.
{
    simulating = (sim_thz > Now());
    sim_mode = goal->get_goal()->sim->mode;
    goal_target = target->get_goal()->get_target(); // f1.
}